

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void __thiscall ChatServer::ChatServer(ChatServer *this)

{
  _Rb_tree_header *p_Var1;
  Stream *pSVar2;
  allocator<char> local_31;
  string local_30 [32];
  
  Dashel::Hub::Hub(&this->super_Hub,true);
  *(undefined ***)this = &PTR__ChatServer_00108d40;
  p_Var1 = &(this->nicks)._M_t._M_impl.super__Rb_tree_header;
  (this->nicks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nicks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nicks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nicks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nicks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_30,"tcpin:port=8765",&local_31);
  pSVar2 = (Stream *)Dashel::Hub::connect((string *)this);
  this->listenStream = pSVar2;
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

ChatServer()
	{
		listenStream = connect("tcpin:port=8765");
	}